

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

int os_banner_getinfo(void *banner_handle,os_banner_info_t *info)

{
  osgen_win_t *win;
  os_banner_info_t *info_local;
  void *banner_handle_local;
  
  info->align = *(int *)((long)banner_handle + 0x20);
  info->style = 0;
  if ((*(uint *)((long)banner_handle + 4) & 1) != 0) {
    info->style = info->style | 8;
  }
  if ((*(uint *)((long)banner_handle + 4) & 8) != 0) {
    info->style = info->style | 0x40;
  }
  if ((*(uint *)((long)banner_handle + 4) & 0x20) != 0) {
    info->style = info->style | 0x80;
  }
  if ((*(uint *)((long)banner_handle + 4) & 0x10) != 0) {
    info->style = info->style | 0x100;
  }
  info->rows = (int)*(undefined8 *)((long)banner_handle + 0x40);
  info->columns = (int)*(undefined8 *)((long)banner_handle + 0x38);
  info->pix_width = 0;
  info->pix_height = 0;
  info->style = info->style | 0x20;
  info->os_line_wrap = 0;
  return 1;
}

Assistant:

int os_banner_getinfo(void *banner_handle, os_banner_info_t *info)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;

    /* set the alignment */
    info->align = win->alignment;

    /* set the flags */
    info->style = 0;
    if ((win->flags & OSGEN_AUTO_VSCROLL) != 0)
        info->style |= OS_BANNER_STYLE_AUTO_VSCROLL;
    if ((win->flags & OSGEN_MOREMODE) != 0)
        info->style |= OS_BANNER_STYLE_MOREMODE;
    if ((win->flags & OSGEN_HSTRUT) != 0)
        info->style |= OS_BANNER_STYLE_HSTRUT;
    if ((win->flags & OSGEN_VSTRUT) != 0)
        info->style |= OS_BANNER_STYLE_VSTRUT;

    /* set the character size */
    info->rows = win->ht;
    info->columns = win->wid;

    /* we're a character-mode platform, so we don't have a pixel size */
    info->pix_width = 0;
    info->pix_height = 0;

    /* 
     *   We are designed for fixed-pitch character-mode displays only, so we
     *   support <TAB> alignment by virtue of our fixed pitch.
     */
    info->style |= OS_BANNER_STYLE_TAB_ALIGN;

    /* we do not do our own line wrapping */
    info->os_line_wrap = FALSE;

    /* indicate success */
    return TRUE;
}